

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcarray.c
# Opt level: O2

LispPTR find_symbol(char *char_base,DLword offset,DLword length,LispPTR hashtbl,DLword fatp,
                   DLword lispp)

{
  LispPTR LVar1;
  uint LAddr;
  ushort uVar2;
  LispPTR LAddr_00;
  LispPTR datum;
  LispPTR array;
  LispPTR datum_00;
  LispPTR LVar3;
  uint uVar4;
  LispPTR *pLVar5;
  uint *puVar6;
  ulong uVar7;
  uint uVar8;
  char *char1;
  
  if (hashtbl == 0) {
    return 0xffffffff;
  }
  if (lispp == 0) {
    uVar2 = compute_hash(char_base,offset,length);
  }
  else {
    uVar2 = compute_lisp_hash(char_base,offset,length,fatp);
  }
  pLVar5 = NativeAligned4FromLAddr(hashtbl);
  datum = *pLVar5;
  datum_00 = pLVar5[1];
LAB_0011d946:
  LAddr_00 = car(datum);
  datum = cdr(datum);
  array = car(datum_00);
  datum_00 = cdr(datum_00);
  pLVar5 = NativeAligned4FromLAddr(LAddr_00);
  LVar1 = pLVar5[2];
  if (LVar1 == 0) {
    return 0xffffffff;
  }
  uVar8 = (uint)uVar2;
  do {
    uVar8 = (int)uVar8 % (int)LVar1 & 0xffff;
    LVar3 = aref1(array,uVar8);
    if ((LVar3 & 0xff) == (uint)(ushort)((ushort)(length ^ uVar2 ^ uVar2 >> 8) % 0xfe + 2)) {
      LVar3 = aref1(LAddr_00,uVar8);
      LAddr = LVar3 & 0xffff;
      if ((LVar3 & 0xfff0000) != 0xe0000) {
        LAddr = LVar3;
      }
      if ((LAddr & 0xfff0000) == 0) {
        puVar6 = (uint *)(AtomSpace + (ulong)(LAddr * 5) * 2);
        pLVar5 = puVar6;
      }
      else {
        pLVar5 = NativeAligned4FromLAddr(LAddr);
        puVar6 = NativeAligned4FromLAddr(LAddr);
      }
      uVar7 = (ulong)((*pLVar5 & 0xfffffff) * 2) + (long)Lisp_world;
      if (*(byte *)(uVar7 ^ 3) == length) {
        uVar4 = (uint)((ulong)*(undefined8 *)(puVar6 + 3) >> 0x2d);
        char1 = (char *)(uVar7 + (uVar4 & 1) + 1);
        if (lispp == 0) {
          LVar3 = compare_chars(char1,char_base + ((ulong)offset << (fatp != 0)),length);
        }
        else {
          LVar3 = compare_lisp_chars(char1,char_base + ((ulong)offset << (fatp != 0)),length,
                                     (ushort)uVar4 & 1,fatp);
        }
        if (LVar3 == 1) {
          return LAddr;
        }
      }
    }
    else if ((LVar3 & 0xff) == 0) break;
    uVar8 = uVar8 + ((int)((long)(ulong)(uint)uVar2 % (long)(int)(LVar1 - 2)) + 1U & 0xffff);
  } while( true );
  if (datum_00 == 0) {
    return 0xffffffff;
  }
  goto LAB_0011d946;
}

Assistant:

LispPTR find_symbol(const char *char_base, DLword offset, DLword length, LispPTR hashtbl, DLword fatp,
                    DLword lispp)

/* T => the "chars" coming in are 16-bit */
/* T => the incoming chars are in LISP space */
{
  DLword hashval, ehashval, h2, ehash, indexvar;
  int arraylen;
  struct hashtable *hashtbladdr;
#ifdef BIGATOMS
  LispPTR vecs, hashes;
#endif /* BIGATOMS */

  LispPTR vec, hash;
  struct arrayheader *vec68k;
  int fatpnamep;

  if (!hashtbl) return (0xffffffff);

  if (lispp)
    hashval = compute_lisp_hash(char_base, offset, length, fatp);
  else
    hashval = compute_hash(char_base, offset, length);

  ehashval = Entry_hash(length, hashval);
  hashtbladdr = (struct hashtable *)NativeAligned4FromLAddr(hashtbl);

  /* Move our string ptr up by offset, allowing for fatness */
  if (fatp)
    char_base += (offset << 1);
  else
    char_base += offset;

#ifdef BIGATOMS
  vecs = hashtbladdr->table;
  hashes = hashtbladdr->hash;

loop_thru_hashtables:

  vec = car(vecs);
  vecs = cdr(vecs);
  hash = car(hashes);
  hashes = cdr(hashes);
  vec68k = (struct arrayheader *)NativeAligned4FromLAddr(vec);
  arraylen = vec68k->totalsize;
  if (arraylen == 0) return (0xffffffff); /*kludge TAKE*/
  h2 = Rehash_factor(hashval, arraylen);
  indexvar = (hashval % arraylen);
#else
  vec = hashtbladdr->table;
  hash = hashtbladdr->hash;
  vec68k = (struct arrayheader *)NativeAligned4FromLAddr(vec);
  arraylen = vec68k->totalsize;
  if (arraylen == 0) return (0xffffffff); /*kludge TAKE*/
  h2 = Rehash_factor(hashval, arraylen);
  indexvar = (hashval % arraylen);
#endif /* BIGATOMS */

retry:
  /* the aref1 returns a smallp, which is always <256, so trim it */
  while (ehashval != (ehash = 0xFF & aref1(hash, indexvar))) {
    if (ehash == NIL) { /* Ran out of entries in this table; try next or fail */
#ifdef BIGATOMS
      if (hashes == NIL) return (0xffffffff); /* Last table.  Fail. */
      goto loop_thru_hashtables;
#else
      return (0xffffffff);
#endif /* BIGATOMS */
    }
    indexvar = Symbol_hash_reprobe(indexvar, h2, arraylen);
  }
  /*   if ((indexvar&0xffff) != NIL) */
  {
    LispPTR index;
    PNCell *pnptr;
    char *pname_base;

    index = aref1(vec, indexvar);
    if ((index & SEGMASK) == S_POSITIVE) index &= 0xFFFF;

    pnptr = (PNCell *)GetPnameCell(index);
    fatpnamep = ((PLCell *)GetPropCell(index))->fatpnamep;
    pname_base = (char *)NativeAligned2FromLAddr(pnptr->pnamebase);
    if ((length == GETBYTE(pname_base)) &&
        (T == ((lispp) ? compare_lisp_chars((pname_base + 1 + fatpnamep), char_base, length,
                                            fatpnamep, fatp)
                       : compare_chars((pname_base + 1 + fatpnamep), char_base, length)))) {
      return (index);
    } else {
      indexvar = Symbol_hash_reprobe(indexvar, h2, arraylen);
      goto retry;
    }
  }
  /*   else return(0xffffffff); */ /* can't find */
}